

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deDirectoryIterator.cpp
# Opt level: O2

FilePath * __thiscall
de::DirectoryIterator::getItem(FilePath *__return_storage_ptr__,DirectoryIterator *this)

{
  FilePath FStack_38;
  
  FilePath::FilePath(&FStack_38,this->m_curEntry->d_name);
  FilePath::join(__return_storage_ptr__,&this->m_path,&FStack_38);
  std::__cxx11::string::~string((string *)&FStack_38);
  return __return_storage_ptr__;
}

Assistant:

FilePath DirectoryIterator::getItem (void) const
{
	DE_ASSERT(hasItem());
	return FilePath::join(m_path, m_curEntry->d_name);
}